

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_mrope_cache_init
               (float theta_base_t,float theta_base_h,float theta_base_w,float theta_base_e,
               int *sections,bool indep_sects,float freq_scale,float *freq_factors,float *corr_dims,
               int64_t ne0,float ext_factor,float mscale,float *cache,float sin_sign,
               float theta_scale)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long i0;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  int local_90;
  
  iVar1 = *sections;
  iVar2 = sections[1];
  lVar5 = (long)sections[2] + (long)iVar2 + (long)iVar1;
  lVar8 = sections[3] + lVar5;
  if (ne0 < lVar8) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ops.cpp"
               ,0x13b2,"GGML_ASSERT(%s) failed","sect_dims <= ne0");
  }
  lVar9 = 0;
  lVar11 = 0;
  fVar15 = theta_base_w;
  fVar17 = theta_base_h;
  fVar13 = theta_base_t;
  fVar12 = theta_base_e;
  for (i0 = 0; i0 < ne0; i0 = i0 + 2) {
    fVar14 = 1.0;
    if (freq_factors != (float *)0x0) {
      fVar14 = freq_factors[lVar11];
    }
    lVar7 = lVar11 % lVar8;
    iVar6 = (int)lVar7;
    iVar10 = (int)((long)iVar2 + (long)iVar1);
    fVar16 = fVar15;
    fVar18 = fVar17;
    if (indep_sects) {
      iVar3 = *sections;
      iVar4 = iVar3;
      fVar19 = theta_base_t;
      if (((lVar7 != 0) && (iVar4 = iVar6, fVar18 = theta_base_h, fVar19 = fVar13, iVar3 != iVar6))
         && (iVar4 = iVar3, fVar16 = theta_base_w, fVar18 = fVar17, iVar10 != iVar6)) {
        local_90 = (int)lVar5;
        fVar12 = (float)((uint)(local_90 == iVar6) * (int)theta_base_e +
                        (uint)(local_90 != iVar6) * (int)fVar12);
        fVar16 = fVar15;
      }
    }
    else {
      iVar4 = *sections;
      fVar19 = fVar13;
    }
    if (((iVar10 <= iVar6) || (fVar13 = fVar18, iVar6 < iVar4)) &&
       ((iVar4 = sections[2] + iVar10, iVar6 < iVar10 || (fVar13 = fVar16, iVar4 <= iVar6)))) {
      fVar13 = (float)((uint)(iVar6 < iVar4) * (int)fVar19 + (uint)(iVar6 >= iVar4) * (int)fVar12);
    }
    rope_yarn(fVar13 / fVar14,freq_scale,corr_dims,i0,ext_factor,mscale,
              (float *)((long)cache + lVar9),(float *)((long)cache + lVar9 + 4));
    lVar9 = lVar9 + 8;
    cache[lVar11 * 2 + 1] = sin_sign * cache[lVar11 * 2 + 1];
    lVar11 = lVar11 + 1;
    fVar13 = fVar19 * theta_scale;
    fVar15 = fVar16 * theta_scale;
    fVar17 = fVar18 * theta_scale;
    fVar12 = fVar12 * theta_scale;
  }
  return;
}

Assistant:

static void ggml_mrope_cache_init(
     float theta_base_t, float theta_base_h, float theta_base_w, float theta_base_e, int sections[4], bool indep_sects,
     float freq_scale, const float * freq_factors, float corr_dims[2], int64_t ne0, float ext_factor, float mscale,
     float * cache, float sin_sign, float theta_scale) {
    // ref: https://github.com/jquesnelle/yarn/blob/master/scaled_rope/LlamaYaRNScaledRotaryEmbedding.py
    float theta_t = theta_base_t;
    float theta_h = theta_base_h;
    float theta_w = theta_base_w;
    float theta_e = theta_base_e;  // extra position id for vision encoder
    int sect_dims = sections[0] + sections[1] + sections[2] + sections[3];
    int sec_w = sections[1] + sections[0];
    int sec_e = sections[2] + sec_w;
    GGML_ASSERT(sect_dims <= ne0);

    for (int64_t i0 = 0; i0 < ne0; i0 += 2) {
        const float ff = freq_factors ? freq_factors[i0/2] : 1.0f;

        int sector = (i0 / 2) % sect_dims;
        if (indep_sects) {
            // compute theta independently for each dim sections
            // (i.e. reset corresponding theta when `i0` go from one section to another)
            if (sector == 0) {
                theta_t = theta_base_t;
            }
            else if (sector == sections[0]) {
                theta_h = theta_base_h;;
            }
            else if (sector == sec_w) {
                theta_w = theta_base_w;
            }
            else if (sector == sec_e) {
                theta_e = theta_base_e;
            }
        }

        float theta = theta_t;
        if (sector >= sections[0] && sector < sec_w) {
            theta = theta_h;
        }
        else if (sector >= sec_w && sector < sec_w + sections[2]) {
            theta = theta_w;
        }
        else if (sector >= sec_w + sections[2]) {
            theta = theta_e;
        }

        rope_yarn(
            theta/ff, freq_scale, corr_dims, i0, ext_factor, mscale, &cache[i0 + 0], &cache[i0 + 1]
        );
        cache[i0 + 1] *= sin_sign;

        theta_t *= theta_scale;
        theta_w *= theta_scale;
        theta_h *= theta_scale;
        theta_e *= theta_scale;
    }
}